

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ilimit_w;
  int *iLimit;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  int *piVar5;
  BYTE *pBVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  size_t sVar11;
  BYTE *iStart;
  int *mEnd;
  BYTE *pBVar12;
  int *piVar13;
  long lVar14;
  BYTE *pBVar15;
  U32 UVar16;
  uint uVar17;
  int *ip;
  seqDef *psVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  size_t offsetFound;
  size_t local_50;
  uint *local_48;
  BYTE *local_40;
  ZSTD_matchState_t *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  iStart = pBVar3 + uVar2;
  uVar20 = *rep;
  pZVar4 = ms->dictMatchState;
  piVar5 = (int *)(pZVar4->window).nextSrc;
  pBVar6 = (pZVar4->window).base;
  local_40 = pBVar6 + (pZVar4->window).dictLimit;
  uVar8 = ((int)src - ((int)iStart + (int)local_40)) + (int)piVar5;
  local_38 = ms;
  if (uVar8 < uVar20) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417a,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ip = (int *)((long)src + (ulong)(uVar8 == 0));
  uVar17 = rep[1];
  if (uVar8 < uVar17) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417b,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iLimit = (int *)(srcSize + (long)src);
  piVar10 = (int *)((long)src + (srcSize - 8));
  if (ip < piVar10) {
    uVar8 = ((int)pBVar6 - (int)piVar5) + uVar2;
    ilimit_w = iLimit + -8;
    local_48 = rep;
    do {
      uVar9 = (((int)ip - (int)pBVar3) - uVar20) + 1;
      piVar13 = (int *)(pBVar3 + uVar9);
      if (uVar9 < uVar2) {
        piVar13 = (int *)(pBVar6 + (uVar9 - uVar8));
      }
      uVar19 = uVar20;
      if ((uVar9 - uVar2 < 0xfffffffd) && (*piVar13 == *(int *)((long)ip + 1))) {
        mEnd = iLimit;
        if (uVar9 < uVar2) {
          mEnd = piVar5;
        }
        sVar11 = ZSTD_count_2segments
                           ((BYTE *)((long)ip + 5),(BYTE *)(piVar13 + 1),(BYTE *)iLimit,(BYTE *)mEnd
                            ,iStart);
        sVar11 = sVar11 + 4;
        UVar16 = 1;
        ip = (int *)((long)ip + 1);
LAB_0013f4fb:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0013f84c:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_0013f86b:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar21 = (long)ip - (long)src;
        pBVar15 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar15 + uVar21) {
LAB_0013f80e:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iLimit < ip) {
LAB_0013f82d:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit_w < ip) {
          ZSTD_safecopyLiterals(pBVar15,(BYTE *)src,(BYTE *)ip,(BYTE *)ilimit_w);
LAB_0013f574:
          seqStore->lit = seqStore->lit + uVar21;
          if (0xffff < uVar21) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar7 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar15 = *src;
          *(undefined8 *)(pBVar15 + 8) = uVar7;
          pBVar15 = seqStore->lit;
          if (0x10 < uVar21) {
            lVar14 = (long)(pBVar15 + 0x10) - ((long)src + 0x10);
            if (lVar14 < 8) {
              if (-0x10 < lVar14) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
            }
            else if (0xffffffffffffffe0 < lVar14 - 0x10U) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar15 + 0x18) = uVar7;
            if (0x20 < (long)uVar21) {
              lVar14 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar14 + 0x20);
                uVar7 = puVar1[1];
                pBVar12 = pBVar15 + lVar14 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar7;
                puVar1 = (undefined8 *)((long)src + lVar14 + 0x30);
                uVar7 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar7;
                lVar14 = lVar14 + 0x20;
              } while (pBVar12 + 0x20 < pBVar15 + uVar21);
            }
            goto LAB_0013f574;
          }
          seqStore->lit = pBVar15 + uVar21;
        }
        psVar18 = seqStore->sequences;
        psVar18->litLength = (U16)uVar21;
        psVar18->offset = UVar16;
        if (0xffff < sVar11 - 3) {
          if (seqStore->longLengthID != 0) {
LAB_0013f88a:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar18->matchLength = (U16)(sVar11 - 3);
        psVar18 = psVar18 + 1;
        seqStore->sequences = psVar18;
        for (ip = (int *)((long)ip + sVar11); uVar20 = uVar19, src = ip, ip <= piVar10;
            ip = (int *)((long)ip + sVar11 + 4)) {
          uVar9 = ((int)ip - (int)pBVar3) - uVar17;
          pBVar15 = pBVar3;
          if (uVar9 < uVar2) {
            pBVar15 = pBVar6 + -(ulong)uVar8;
          }
          if ((0xfffffffc < uVar9 - uVar2) || (*(int *)(pBVar15 + uVar9) != *ip)) break;
          piVar13 = iLimit;
          if (uVar9 < uVar2) {
            piVar13 = piVar5;
          }
          sVar11 = ZSTD_count_2segments
                             ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar15 + uVar9) + 4),(BYTE *)iLimit,
                              (BYTE *)piVar13,iStart);
          if (seqStore->maxNbSeq <= (ulong)((long)psVar18 - (long)seqStore->sequencesStart >> 3))
          goto LAB_0013f84c;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0013f86b;
          pBVar15 = seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < pBVar15) goto LAB_0013f80e;
          if (iLimit < ip) goto LAB_0013f82d;
          if (ilimit_w < ip) {
            ZSTD_safecopyLiterals(pBVar15,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
          }
          else {
            uVar7 = *(undefined8 *)(ip + 2);
            *(undefined8 *)pBVar15 = *(undefined8 *)ip;
            *(undefined8 *)(pBVar15 + 8) = uVar7;
          }
          psVar18 = seqStore->sequences;
          psVar18->litLength = 0;
          psVar18->offset = 1;
          if (0xffff < sVar11 + 1) {
            if (seqStore->longLengthID != 0) goto LAB_0013f88a;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar18->matchLength = (U16)(sVar11 + 1);
          psVar18 = psVar18 + 1;
          seqStore->sequences = psVar18;
          uVar19 = uVar17;
          uVar17 = uVar20;
        }
      }
      else {
        local_50 = 999999999;
        sVar11 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                           (local_38,(BYTE *)ip,(BYTE *)iLimit,&local_50);
        if (3 < sVar11) {
          if (local_50 == 0) {
            UVar16 = 1;
          }
          else {
            uVar21 = (long)ip + (-(long)pBVar3 - local_50) + -0xfffffffe;
            pBVar12 = pBVar3;
            pBVar15 = iStart;
            if ((uint)uVar21 < uVar2) {
              pBVar12 = pBVar6 + -(ulong)uVar8;
              pBVar15 = local_40;
            }
            if ((src < ip) && (uVar21 = uVar21 & 0xffffffff, pBVar15 < pBVar12 + uVar21)) {
              pBVar12 = pBVar12 + uVar21;
              do {
                piVar13 = (int *)((long)ip + -1);
                pBVar12 = pBVar12 + -1;
                if ((*(BYTE *)piVar13 != *pBVar12) ||
                   (sVar11 = sVar11 + 1, ip = piVar13, piVar13 <= src)) break;
              } while (pBVar15 < pBVar12);
            }
            UVar16 = (int)local_50 + 1;
            uVar19 = (int)local_50 - 2;
            uVar17 = uVar20;
          }
          goto LAB_0013f4fb;
        }
        ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
      }
      rep = local_48;
    } while (ip < piVar10);
  }
  *rep = uVar20;
  rep[1] = uVar17;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dictMatchState);
}